

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::ReadCollectionFont
               (Buffer *file,uint8_t *data,size_t len,Font *font,
               map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
               *all_tables)

{
  bool bVar1;
  Table *pTVar2;
  mapped_type *ppTVar3;
  _Self local_70;
  _Self local_68;
  Table *local_60;
  Table *table;
  pair<const_unsigned_int,_woff2::Font::Table> *entry;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *__range1;
  map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  *all_tables_local;
  Font *font_local;
  size_t len_local;
  uint8_t *data_local;
  Buffer *file_local;
  
  bVar1 = Buffer::ReadU32(file,&font->flavor);
  if (bVar1) {
    bVar1 = ReadTrueTypeFont(file,data,len,font);
    if (bVar1) {
      __end1 = std::
               map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
               ::begin(&font->tables);
      entry = (pair<const_unsigned_int,_woff2::Font::Table> *)
              std::
              map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
              ::end(&font->tables);
      while( true ) {
        bVar1 = std::operator!=(&__end1,(_Self *)&entry);
        if (!bVar1) break;
        table = (Table *)std::_Rb_tree_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>
                         ::operator*(&__end1);
        local_60 = &((reference)table)->second;
        local_68._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
             ::find(all_tables,&(((reference)table)->second).offset);
        local_70._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
             ::end(all_tables);
        bVar1 = std::operator==(&local_68,&local_70);
        if (bVar1) {
          pTVar2 = Font::FindTable(font,local_60->tag);
          ppTVar3 = std::
                    map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                    ::operator[](all_tables,&local_60->offset);
          *ppTVar3 = pTVar2;
        }
        else {
          ppTVar3 = std::
                    map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                    ::operator[](all_tables,&local_60->offset);
          local_60->reuse_of = *ppTVar3;
        }
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::operator++
                  (&__end1);
      }
      file_local._7_1_ = true;
    }
    else {
      file_local._7_1_ = false;
    }
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool ReadCollectionFont(Buffer* file, const uint8_t* data, size_t len,
                        Font* font,
                        std::map<uint32_t, Font::Table*>* all_tables) {
  if (!file->ReadU32(&font->flavor)) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (!ReadTrueTypeFont(file, data, len, font)) {
    return FONT_COMPRESSION_FAILURE();
  }

  for (auto& entry : font->tables) {
    Font::Table& table = entry.second;

    if (all_tables->find(table.offset) == all_tables->end()) {
      (*all_tables)[table.offset] = font->FindTable(table.tag);
    } else {
      table.reuse_of = (*all_tables)[table.offset];
    }

  }
  return true;
}